

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall
embree::Instantiator::Instantiator
          (Instantiator *this,Ref<embree::HeightField> *heightField,
          Ref<embree::SceneGraph::Node> *object,Ref<embree::Image> *distribution,float minDistance,
          size_t N)

{
  HeightField *pHVar1;
  Node *pNVar2;
  ulong uVar3;
  long lVar4;
  size_t x;
  ulong uVar5;
  ulong uVar6;
  size_t height;
  size_t width;
  vector<float,_std::allocator<float>_> values;
  undefined1 local_98 [8];
  float afStack_90 [4];
  Instantiator *local_80;
  __shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70;
  size_t local_68;
  size_t local_60;
  ulong local_58;
  _Vector_base<float,_std::allocator<float>_> local_50;
  pointer local_38;
  
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Instantiator_001c4ec8;
  pHVar1 = heightField->ptr;
  (this->heightField).ptr = pHVar1;
  if (pHVar1 != (HeightField *)0x0) {
    (*(pHVar1->super_RefCount)._vptr_RefCount[2])();
  }
  pNVar2 = object->ptr;
  (this->object).ptr = pNVar2;
  if (pNVar2 != (Node *)0x0) {
    (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
  }
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->N = N;
  uVar3 = distribution->ptr->width;
  local_68 = distribution->ptr->height;
  local_60 = local_68;
  local_58 = uVar3;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_50,local_68 * uVar3,
             (allocator_type *)local_98);
  local_78 = &(this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>;
  local_70 = uVar3 * 4;
  lVar4 = 0;
  local_80 = this;
  for (uVar6 = 0; uVar6 < local_68; uVar6 = uVar6 + 1) {
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      (*(distribution->ptr->super_RefCount)._vptr_RefCount[4])
                (local_98,distribution->ptr,uVar5,uVar6);
      *(float *)((long)local_50._M_impl.super__Vector_impl_data._M_start + uVar5 * 4 + lVar4) =
           (float)local_98._0_4_ * 0.212671 +
           (float)local_98._4_4_ * 0.71516 + afStack_90[0] * 0.072169;
    }
    lVar4 = lVar4 + local_70;
  }
  local_38 = local_50._M_impl.super__Vector_impl_data._M_start;
  std::make_shared<embree::Distribution2D,float*,unsigned_long&,unsigned_long&>
            ((float **)local_98,(unsigned_long *)&local_38,&local_58);
  std::__shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>::operator=
            (local_78,(__shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2> *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)afStack_90);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

Instantiator(const Ref<HeightField>& heightField,
                 const Ref<SceneGraph::Node>& object, const Ref<Image>& distribution, float minDistance, size_t N)
      : heightField(heightField), object(object), /*minDistance(minDistance),*/ N(N)
    {
      /* create distribution */
      size_t width = distribution->width;
      size_t height = distribution->height;
      std::vector<float> values(width*height);
      for (size_t y=0; y<height; y++)
        for (size_t x=0; x<width; x++)
          values[y*width+x] = luminance(distribution->get(x,y));
      dist = std::make_shared<Distribution2D>(values.data(),width,height);
    }